

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_lua.c
# Opt level: O0

int luv_buffer_new(lua_State *L)

{
  lua_Integer lVar1;
  luv_buffer_t *buffer_00;
  luv_buffer_t *buffer;
  lua_Integer length;
  lua_State *L_local;
  
  lVar1 = luaL_optinteger(L,1,0x20000);
  buffer_00 = (luv_buffer_t *)lua_newuserdata(L,0x30);
  lua_getfield(L,-0xf4628,"luv_buffer_t");
  lua_setmetatable(L,-2);
  buffer_init(buffer_00,(int)lVar1);
  return 1;
}

Assistant:

static int luv_buffer_new(lua_State* L)
{
	lua_Integer length = luaL_optinteger(L, 1, 128 * 1024);

	luv_buffer_t* buffer = NULL;
	buffer = lua_newuserdata(L, sizeof(*buffer));
	luaL_getmetatable(L, LUV_BUFFER);
	lua_setmetatable(L, -2);

	buffer_init(buffer, length);

	return 1;
}